

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawable.h
# Opt level: O1

rectangle * __thiscall dlib::drawable::get_rect(rectangle *__return_storage_ptr__,drawable *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  auto_mutex M;
  auto_mutex local_30;
  
  local_30.r = this->m;
  local_30.m = (mutex *)0x0;
  local_30.rw = (read_write_mutex *)0x0;
  rmutex::lock(local_30.r,1);
  lVar1 = (this->rect).l;
  lVar2 = (this->rect).t;
  lVar3 = (this->rect).b;
  __return_storage_ptr__->r = (this->rect).r;
  __return_storage_ptr__->b = lVar3;
  __return_storage_ptr__->l = lVar1;
  __return_storage_ptr__->t = lVar2;
  auto_mutex::unlock(&local_30);
  return __return_storage_ptr__;
}

Assistant:

const rectangle get_rect (
        ) const 
        {
            auto_mutex M(m);
            return rect;
        }